

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemX_time.cpp
# Opt level: O0

Am_Wrapper * __thiscall Am_Time_Data::Make_Unique(Am_Time_Data *this)

{
  bool bVar1;
  Am_Time_Data *this_local;
  
  bVar1 = Am_Wrapper::Is_Unique(&this->super_Am_Wrapper);
  this_local = this;
  if (!bVar1) {
    Am_Wrapper::Release(&this->super_Am_Wrapper);
    this_local = (Am_Time_Data *)operator_new(0x20);
    Am_Time_Data(this_local,this);
  }
  return &this_local->super_Am_Wrapper;
}

Assistant:

void
Am_Time_Data::Print(std::ostream &os) const
{
  //  os << time.tv_sec <<"s:"<< time.tv_usec << "us";
  os << time.tv_sec * 1000 + time.tv_usec / 1000 << " milliseconds";
}